

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void set_want_move(Am_Object *inter,bool want_move)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  undefined1 local_68 [8];
  Am_Value_List new_list;
  Am_Value value;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object main_win;
  Am_Object owner;
  bool want_move_local;
  Am_Object *inter_local;
  
  Am_Object::Am_Object(&main_win);
  Am_Object::Am_Object(&local_28);
  Am_Object::Get_Owner(local_40,(Am_Slot_Flags)inter);
  Am_Object::operator=(&main_win,local_40);
  Am_Object::~Am_Object(local_40);
  bVar1 = Am_Object::Valid(&main_win);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&main_win,0x68,0);
    Am_Object::operator=(&local_28,pAVar3);
    bVar1 = Am_Object::Valid(&local_28);
    if (bVar1) {
      Am_Object::Am_Object((Am_Object *)&value.value,&local_28);
      set_want_move_one_win((Am_Object *)&value.value,want_move);
      Am_Object::~Am_Object((Am_Object *)&value.value);
    }
    Am_Value::Am_Value((Am_Value *)&new_list.item);
    pAVar3 = Am_Object::Peek(inter,0x118,0);
    Am_Value::operator=((Am_Value *)&new_list.item,pAVar3);
    bVar1 = Am_Value::Valid((Am_Value *)&new_list.item);
    if (!bVar1) {
      pAVar3 = Am_Object::Peek(inter,0x116,0);
      Am_Value::operator=((Am_Value *)&new_list.item,pAVar3);
    }
    if ((short)new_list.item == 2) {
      iVar2 = Am_Value::operator_cast_to_int((Am_Value *)&new_list.item);
      if (iVar2 != 0) {
        set_want_move_all_wins(&Am_Window,want_move);
      }
    }
    else if ((short)new_list.item == 4) {
      bVar1 = Am_Value::operator_cast_to_bool((Am_Value *)&new_list.item);
      if (bVar1) {
        set_want_move_all_wins(&Am_Window,want_move);
      }
    }
    else if ((short)new_list.item == -0x5ffe) {
      Am_Value_List::Am_Value_List((Am_Value_List *)local_68);
      Am_Value_List::operator=((Am_Value_List *)local_68,(Am_Value *)&new_list.item);
      bVar1 = Am_Object::Valid(&local_28);
      if (bVar1) {
        set_want_move_for_objs_wins((Am_Value_List *)local_68,&local_28,want_move);
      }
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_68);
    }
    Am_Value::~Am_Value((Am_Value *)&new_list.item);
  }
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&main_win);
  return;
}

Assistant:

static void
set_want_move(const Am_Object &inter, bool want_move)
{
  //first do the main window
  Am_Object owner, main_win;
  owner = inter.Get_Owner();
  if (owner.Valid()) {
    main_win = owner.Get(Am_WINDOW);
    if (main_win.Valid())
      set_want_move_one_win(main_win, want_move);

    // next, do any other windows
    Am_Value value;
    value = inter.Peek(Am_ALL_WINDOWS);
    if (!value.Valid())
      value = inter.Peek(Am_MULTI_OWNERS);
    switch (value.type) {
    case Am_INT:
      if ((int)value != 0)
        //Am_window is root of instance tree
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_BOOL:
      if ((bool)value != false)
        set_want_move_all_wins(Am_Window, want_move);
      break;
    case Am_VALUE_LIST: { //a list of objects
      Am_Value_List new_list;
      new_list = value;
      if (main_win.Valid())
        set_want_move_for_objs_wins(new_list, main_win, want_move);
      break;
    }
    } // end switch on new value
  }
}